

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O1

void __thiscall
duckdb::RLEScanState<duckdb::uhugeint_t>::RLEScanState
          (RLEScanState<duckdb::uhugeint_t> *this,ColumnSegment *segment)

{
  BufferManager *pBVar1;
  pointer *__ptr;
  BufferHandle BStack_38;
  
  (this->super_SegmentScanState)._vptr_SegmentScanState = (_func_int **)&PTR__RLEScanState_0248ebf8;
  BufferHandle::BufferHandle(&this->handle);
  (this->matching_runs).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  this->matching_run_count = 0;
  pBVar1 = BufferManager::GetBufferManager(segment->db);
  (*pBVar1->_vptr_BufferManager[7])(&BStack_38,pBVar1,&segment->block);
  BufferHandle::operator=(&this->handle,&BStack_38);
  BufferHandle::~BufferHandle(&BStack_38);
  this->entry_pos = 0;
  this->position_in_entry = 0;
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(this->handle).node);
  this->rle_count_offset = *(uint32_t *)(((this->handle).node.ptr)->buffer + segment->offset);
  return;
}

Assistant:

explicit RLEScanState(ColumnSegment &segment) {
		auto &buffer_manager = BufferManager::GetBufferManager(segment.db);
		handle = buffer_manager.Pin(segment.block);
		entry_pos = 0;
		position_in_entry = 0;
		rle_count_offset = UnsafeNumericCast<uint32_t>(Load<uint64_t>(handle.Ptr() + segment.GetBlockOffset()));
		D_ASSERT(rle_count_offset <= segment.GetBlockManager().GetBlockSize());
	}